

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sendf.c
# Opt level: O0

void Curl_infof(SessionHandle *data,char *fmt,...)

{
  char in_AL;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined1 local_8f8 [16];
  undefined8 local_8e8;
  undefined8 local_8e0;
  undefined8 local_8d8;
  undefined8 local_8d0;
  undefined8 local_8c8;
  undefined8 local_8b8;
  undefined8 local_8a8;
  undefined8 local_898;
  undefined8 local_888;
  undefined8 local_878;
  undefined8 local_868;
  undefined8 local_858;
  char local_848 [8];
  char print_buffer [2049];
  size_t len;
  va_list ap;
  char *fmt_local;
  SessionHandle *data_local;
  
  if (in_AL != '\0') {
    local_8c8 = in_XMM0_Qa;
    local_8b8 = in_XMM1_Qa;
    local_8a8 = in_XMM2_Qa;
    local_898 = in_XMM3_Qa;
    local_888 = in_XMM4_Qa;
    local_878 = in_XMM5_Qa;
    local_868 = in_XMM6_Qa;
    local_858 = in_XMM7_Qa;
  }
  if ((data != (SessionHandle *)0x0) && (((data->set).verbose & 1U) != 0)) {
    ap[0].overflow_arg_area = local_8f8;
    ap[0]._0_8_ = &stack0x00000008;
    len._4_4_ = 0x30;
    len._0_4_ = 0x10;
    local_8e8 = in_RDX;
    local_8e0 = in_RCX;
    local_8d8 = in_R8;
    local_8d0 = in_R9;
    curl_mvsnprintf(local_848,0x801,fmt,(__va_list_tag *)&len);
    register0x00000000 = strlen(local_848);
    Curl_debug(data,CURLINFO_TEXT,local_848,register0x00000000,(connectdata *)0x0);
  }
  return;
}

Assistant:

void Curl_infof(struct SessionHandle *data, const char *fmt, ...)
{
  if(data && data->set.verbose) {
    va_list ap;
    size_t len;
    char print_buffer[2048 + 1];
    va_start(ap, fmt);
    vsnprintf(print_buffer, sizeof(print_buffer), fmt, ap);
    va_end(ap);
    len = strlen(print_buffer);
    Curl_debug(data, CURLINFO_TEXT, print_buffer, len, NULL);
  }
}